

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFGdbIndex.cpp
# Opt level: O1

void __thiscall llvm::DWARFGdbIndex::dumpCUList(DWARFGdbIndex *this,raw_ostream *OS)

{
  undefined1 auVar1 [16];
  char *__n;
  undefined8 uVar2;
  raw_ostream *this_00;
  void *__buf;
  int iVar3;
  long lVar4;
  ulong uVar5;
  format_object_base local_60;
  undefined1 local_50 [16];
  int local_40;
  void *local_38;
  
  uVar2 = local_50._0_8_;
  local_50._4_4_ = 0;
  local_50._0_4_ =
       (this->CuList).super_SmallVectorImpl<llvm::DWARFGdbIndex::CompUnitEntry>.
       super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::CompUnitEntry,_true>.
       super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>.
       super_SmallVectorBase.Size;
  local_60.Fmt = "\n  CU list offset = 0x%x, has %ld entries:";
  local_60._vptr_format_object_base = (_func_int **)&PTR_home_01098010;
  local_50._12_4_ = SUB84(uVar2,4);
  local_50._8_4_ = this->CuListOffset;
  this_00 = raw_ostream::operator<<(OS,&local_60);
  __n = this_00->OutBufCur;
  if (__n < this_00->OutBufEnd) {
    this_00->OutBufCur = __n + 1;
    *__n = '\n';
  }
  else {
    raw_ostream::write(this_00,10,__buf,(size_t)__n);
  }
  uVar5 = (ulong)(this->CuList).super_SmallVectorImpl<llvm::DWARFGdbIndex::CompUnitEntry>.
                 super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::CompUnitEntry,_true>.
                 super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>.
                 super_SmallVectorBase.Size;
  if (uVar5 != 0) {
    local_38 = (this->CuList).super_SmallVectorImpl<llvm::DWARFGdbIndex::CompUnitEntry>.
               super_SmallVectorTemplateBase<llvm::DWARFGdbIndex::CompUnitEntry,_true>.
               super_SmallVectorTemplateCommon<llvm::DWARFGdbIndex::CompUnitEntry,_void>.
               super_SmallVectorBase.BeginX;
    lVar4 = 0;
    local_40 = 0;
    do {
      local_60.Fmt = "    %d: Offset = 0x%llx, Length = 0x%llx\n";
      local_60._vptr_format_object_base = (_func_int **)&PTR_home_010988f8;
      auVar1 = *(undefined1 (*) [16])((long)local_38 + lVar4);
      local_50._0_8_ = auVar1._8_8_;
      local_50._8_4_ = auVar1._0_4_;
      local_50._12_4_ = auVar1._4_4_;
      iVar3 = local_40 + 1;
      raw_ostream::operator<<(OS,&local_60);
      lVar4 = lVar4 + 0x10;
      local_40 = iVar3;
    } while (uVar5 << 4 != lVar4);
  }
  return;
}

Assistant:

void DWARFGdbIndex::dumpCUList(raw_ostream &OS) const {
  OS << format("\n  CU list offset = 0x%x, has %" PRId64 " entries:",
               CuListOffset, (uint64_t)CuList.size())
     << '\n';
  uint32_t I = 0;
  for (const CompUnitEntry &CU : CuList)
    OS << format("    %d: Offset = 0x%llx, Length = 0x%llx\n", I++, CU.Offset,
                 CU.Length);
}